

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O1

void asm_snap_alloc(ASMState *as,int snapno)

{
  uint uVar1;
  SnapShot *pSVar2;
  SnapEntry *pSVar3;
  uint ref;
  ulong uVar4;
  ulong uVar5;
  
  pSVar2 = as->T->snap;
  uVar1 = pSVar2[snapno].mapofs;
  pSVar3 = as->T->snapmap;
  uVar5 = (ulong)pSVar2[snapno].nent;
  as->snapfilt1 = 0;
  as->snapfilt2 = 0;
  if (uVar5 != 0) {
    uVar4 = 0;
    do {
      ref = (uint)(ushort)pSVar3[uVar1 + uVar4];
      if (0x7fff < ref) {
        asm_snap_alloc1(as,ref);
      }
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  return;
}

Assistant:

static void asm_snap_alloc(ASMState *as, int snapno)
{
  SnapShot *snap = &as->T->snap[snapno];
  SnapEntry *map = &as->T->snapmap[snap->mapofs];
  MSize n, nent = snap->nent;
  as->snapfilt1 = as->snapfilt2 = 0;
  for (n = 0; n < nent; n++) {
    SnapEntry sn = map[n];
    IRRef ref = snap_ref(sn);
    if (!irref_isk(ref)) {
      asm_snap_alloc1(as, ref);
      if (LJ_SOFTFP && (sn & SNAP_SOFTFPNUM)) {
	lj_assertA(irt_type(IR(ref+1)->t) == IRT_SOFTFP,
		   "snap %d[%d] points to bad SOFTFP IR %04d",
		   snapno, n, ref - REF_BIAS);
	asm_snap_alloc1(as, ref+1);
      }
    }
  }
}